

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void jsonAppendPathName(JsonEachCursor *p)

{
  u32 i;
  u32 uVar1;
  byte *pbVar2;
  char *zFormat;
  long lVar3;
  int N;
  long in_FS_OFFSET;
  u32 sz;
  u32 local_24;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (p->eType == '\v') {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      jsonPrintf(0x1e,&p->path,"[%lld]");
      return;
    }
  }
  else {
    local_24 = 0;
    i = p->i;
    uVar1 = jsonbPayloadSize(&p->sParse,i,&local_24);
    pbVar2 = (p->sParse).aBlob + (uVar1 + i);
    if (((ulong)local_24 == 0) || ((""[*pbVar2] & 2) == 0)) {
LAB_00200b9a:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        N = local_24 + 4;
        zFormat = ".\"%.*s\"";
LAB_00200bb8:
        jsonPrintf(N,&p->path,zFormat,(ulong)local_24,pbVar2);
        return;
      }
    }
    else {
      lVar3 = 0;
      do {
        if ((""[pbVar2[lVar3]] & 6) == 0) goto LAB_00200b9a;
        lVar3 = lVar3 + 1;
      } while (local_24 != (uint)lVar3);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        N = local_24 + 2;
        zFormat = ".%.*s";
        goto LAB_00200bb8;
      }
    }
  }
  __stack_chk_fail();
}

Assistant:

static void jsonAppendPathName(JsonEachCursor *p){
  assert( p->nParent>0 );
  assert( p->eType==JSONB_ARRAY || p->eType==JSONB_OBJECT );
  if( p->eType==JSONB_ARRAY ){
    jsonPrintf(30, &p->path, "[%lld]", p->aParent[p->nParent-1].iKey);
  }else{
    u32 n, sz = 0, k, i;
    const char *z;
    int needQuote = 0;
    n = jsonbPayloadSize(&p->sParse, p->i, &sz);
    k = p->i + n;
    z = (const char*)&p->sParse.aBlob[k];
    if( sz==0 || !sqlite3Isalpha(z[0]) ){
      needQuote = 1;
    }else{
      for(i=0; i<sz; i++){
        if( !sqlite3Isalnum(z[i]) ){
          needQuote = 1;
          break;
        }
      }
    }
    if( needQuote ){
      jsonPrintf(sz+4,&p->path,".\"%.*s\"", sz, z);
    }else{
      jsonPrintf(sz+2,&p->path,".%.*s", sz, z);
    }
  }
}